

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O1

bool __thiscall DCanvas::ClipBox(DCanvas *this,int *x,int *y,int *w,int *h,BYTE **src,int srcpitch)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  
  iVar1 = *x;
  bVar3 = true;
  bVar4 = true;
  if ((((iVar1 < this->Width) && (iVar2 = *y, bVar4 = bVar3, iVar2 < this->Height)) &&
      (iVar5 = *w + iVar1, iVar5 != 0 && SCARRY4(*w,iVar1) == iVar5 < 0)) &&
     (iVar2 + *h != 0 && SCARRY4(iVar2,*h) == iVar2 + *h < 0)) {
    if (iVar1 < 0) {
      *src = *src + -(long)iVar1;
      *w = iVar5;
      *x = 0;
    }
    if (this->Width < *w + *x) {
      *w = this->Width - *x;
    }
    iVar1 = *y;
    if (iVar1 < 0) {
      *src = *src + -(long)(srcpitch * iVar1);
      *h = *h + iVar1;
      *y = 0;
    }
    if (this->Height < *h + *y) {
      *h = this->Height - *y;
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool DCanvas::ClipBox (int &x, int &y, int &w, int &h, const BYTE *&src, const int srcpitch) const
{
	if (x >= Width || y >= Height || x+w <= 0 || y+h <= 0)
	{ // Completely clipped off screen
		return true;
	}
	if (x < 0)				// clip left edge
	{
		src -= x;
		w += x;
		x = 0;
	}
	if (x+w > Width)		// clip right edge
	{
		w = Width - x;
	}
	if (y < 0)				// clip top edge
	{
		src -= y*srcpitch;
		h += y;
		y = 0;
	}
	if (y+h > Height)		// clip bottom edge
	{
		h = Height - y;
	}
	return false;
}